

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

int * __thiscall ON_MeshTopology::GetIntArray(ON_MeshTopology *this,int length)

{
  memchunk *pmVar1;
  memchunk *pm;
  int *a;
  int length_local;
  ON_MeshTopology *this_local;
  
  pm = (memchunk *)0x0;
  if ((0 < length) &&
     (pmVar1 = (memchunk *)onmalloc((long)length * 4 + 8), pmVar1 != (memchunk *)0x0)) {
    pmVar1->next = this->m_memchunk;
    pm = pmVar1 + 1;
    this->m_memchunk = pmVar1;
  }
  return (int *)pm;
}

Assistant:

int* ON_MeshTopology::GetIntArray(int length)
{
  int* a = 0;
  if ( length > 0 ) {
    struct memchunk* pm;
    pm = (struct memchunk*)onmalloc(length*sizeof(*a) + sizeof(*pm));
    if ( pm ) {
      pm->next = m_memchunk;
      m_memchunk = pm++;
      a = (int*)pm;
    }
  }
  return a;
}